

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool run_simple_msgpack_test(void)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *local_780;
  allocator<char> local_759;
  string local_758;
  sub_form local_738;
  string_validator local_728;
  allocator<char> local_711;
  string local_710;
  sub_form local_6f0;
  number_validator<unsigned_long> local_6e0;
  allocator<char> local_6c9;
  string local_6c8;
  sub_form local_6a8;
  number_validator<unsigned_int> local_698;
  allocator<char> local_681;
  string local_680;
  sub_form local_660;
  number_validator<unsigned_short> local_650;
  allocator<char> local_639;
  string local_638;
  sub_form local_618;
  number_validator<unsigned_char> local_608;
  allocator<char> local_5f1;
  string local_5f0;
  sub_form local_5d0;
  number_validator<long> local_5c0;
  allocator<char> local_5a9;
  string local_5a8;
  sub_form local_588;
  number_validator<int> local_578;
  allocator<char> local_561;
  string local_560;
  sub_form local_540;
  number_validator<short> local_530;
  allocator<char> local_519;
  string local_518;
  sub_form local_4f8;
  number_validator<signed_char> local_4e8;
  allocator<char> local_4d1;
  string local_4d0;
  sub_form local_4b0;
  boolean_validator local_499;
  __0 local_498;
  char local_497;
  short local_496;
  int local_494;
  anon_struct_64_10_cf75279b form_data;
  form form;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  uchar local_3fc [27];
  bool local_3e1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_228;
  iterator local_1f8;
  size_type local_1f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  local_1e8;
  undefined1 local_1b8 [8];
  any var2;
  any var;
  stringstream ss;
  ostream local_188 [383];
  byte local_9;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&var._M_storage);
  std::any::any((any *)&var2._M_storage);
  std::any::any((any *)local_1b8);
  form.error_.message_.field_2._M_local_buf[0xe] = '\x01';
  local_3e0 = &local_3d8;
  local_3e1 = true;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[5],_bool,_true>(local_3e0,(char (*) [5])"bool",&local_3e1);
  local_3e0 = &local_3a8;
  local_3fc[7] = 0xf8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[5],_signed_char,_true>
            (local_3e0,(char (*) [5])0x19c3bf,(char *)(local_3fc + 7));
  local_3e0 = &local_378;
  local_3fc[6] = 0xf0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_signed_char,_true>
            (local_3e0,(char (*) [6])0x19c3c5,(char *)(local_3fc + 6));
  local_3e0 = &local_348;
  local_3fc[5] = 0xe0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_signed_char,_true>
            (local_3e0,(char (*) [6])0x19c3cc,(char *)(local_3fc + 5));
  local_3e0 = &local_318;
  local_3fc[4] = 0xc0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_signed_char,_true>
            (local_3e0,(char (*) [6])0x19c3d3,(char *)(local_3fc + 4));
  local_3e0 = &local_2e8;
  local_3fc[3] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_unsigned_char,_true>(local_3e0,(char (*) [6])"uint8",local_3fc + 3);
  local_3e0 = &local_2b8;
  local_3fc[2] = 0x10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_unsigned_char,_true>(local_3e0,(char (*) [7])"uint16",local_3fc + 2);
  local_3e0 = &local_288;
  local_3fc[1] = 0x20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_unsigned_char,_true>(local_3e0,(char (*) [7])"uint32",local_3fc + 1);
  local_3e0 = &local_258;
  local_3fc[0] = '@';
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_unsigned_char,_true>(local_3e0,(char (*) [7])"uint64",local_3fc);
  local_3e0 = &local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"sting value",
             (allocator<char> *)(form.error_.message_.field_2._M_local_buf + 0xf));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_228,(char (*) [7])"string",&local_420);
  form.error_.message_.field_2._M_local_buf[0xe] = '\0';
  local_1f8 = &local_3d8;
  local_1f0 = 10;
  this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
          *)(form.error_.message_.field_2._M_local_buf + 0xc);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  ::allocator(this);
  __l._M_len = local_1f0;
  __l._M_array = local_1f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map(&local_1e8,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        (form.error_.message_.field_2._M_local_buf + 0xd),this);
  std::any::operator=((any *)&var2._M_storage,&local_1e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~map(&local_1e8);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                *)(form.error_.message_.field_2._M_local_buf + 0xc));
  local_780 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
               *)&local_1f8;
  do {
    local_780 = local_780 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair(local_780);
  } while (local_780 != &local_3d8);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator
            ((allocator<char> *)(form.error_.message_.field_2._M_local_buf + 0xf));
  goodform::msgpack::serialize((any *)&var2._M_storage,local_188);
  goodform::msgpack::deserialize((istream *)&var._M_storage,(any *)local_1b8);
  goodform::form::form((form *)((long)&form_data.str.field_2 + 8),(any *)local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"bool",&local_4d1);
  local_4b0 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_4d0);
  local_499 = goodform::sub_form::boolean(&local_4b0);
  local_498 = (__0)goodform::boolean_validator::val(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"int8",&local_519);
  local_4f8 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_518);
  goodform::sub_form::int8((sub_form *)&local_4e8);
  local_497 = goodform::number_validator<signed_char>::val(&local_4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"int16",&local_561);
  local_540 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_560);
  goodform::sub_form::int16((sub_form *)&local_530);
  local_496 = goodform::number_validator<short>::val(&local_530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"int32",&local_5a9);
  local_588 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_5a8);
  goodform::sub_form::int32((sub_form *)&local_578);
  local_494 = goodform::number_validator<int>::val(&local_578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"int64",&local_5f1);
  local_5d0 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_5f0);
  goodform::sub_form::int64((sub_form *)&local_5c0);
  form_data._0_8_ = goodform::number_validator<long>::val(&local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"uint8",&local_639);
  local_618 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_638);
  goodform::sub_form::uint8((sub_form *)&local_608);
  form_data.int64._0_1_ = goodform::number_validator<unsigned_char>::val(&local_608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"uint16",&local_681);
  local_660 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_680);
  goodform::sub_form::uint16((sub_form *)&local_650);
  form_data.int64._2_2_ = goodform::number_validator<unsigned_short>::val(&local_650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"uint32",&local_6c9);
  local_6a8 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_6c8);
  goodform::sub_form::uint32((sub_form *)&local_698);
  form_data.int64._4_4_ = goodform::number_validator<unsigned_int>::val(&local_698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"uint64",&local_711);
  local_6f0 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_710);
  goodform::sub_form::uint64((sub_form *)&local_6e0);
  form_data._16_8_ = goodform::number_validator<unsigned_long>::val(&local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"string",&local_759);
  local_738 = goodform::sub_form::at((sub_form *)((long)&form_data.str.field_2 + 8),&local_758);
  local_728 = goodform::sub_form::string(&local_738);
  psVar2 = goodform::string_validator::val_abi_cxx11_(&local_728);
  std::__cxx11::string::string((string *)&form_data.uint64,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  bVar1 = goodform::form::is_good((form *)((long)&form_data.str.field_2 + 8));
  if (bVar1) {
    if ((((((((byte)local_498 & 1) != 0) && (local_497 == -8)) && (local_496 == -0x10)) &&
         ((local_494 == -0x20 && (form_data._0_8_ == -0x40)))) &&
        (((uchar)form_data.int64 == '\b' &&
         ((form_data.int64._2_2_ == 0x10 && (form_data.int64._4_4_ == 0x20)))))) &&
       (form_data._16_8_ == 0x40)) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &form_data.uint64,"sting value");
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Simple MsgPack passed.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_9 = 1;
        goto LAB_0015e4a7;
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Simple MsgPack FAILED!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_9 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Simple MsgPack FAILED!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_9 = 0;
  }
LAB_0015e4a7:
  run_simple_msgpack_test()::$_0::~__0(&local_498);
  goodform::form::~form((form *)((long)&form_data.str.field_2 + 8));
  std::any::~any((any *)local_1b8);
  std::any::~any((any *)&var2._M_storage);
  std::__cxx11::stringstream::~stringstream((stringstream *)&var._M_storage);
  return (bool)(local_9 & 1);
}

Assistant:

bool run_simple_msgpack_test()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"bool", true},
      {"int8", std::int8_t(-8)},
      {"int16", std::int8_t(-16)},
      {"int32", std::int8_t(-32)},
      {"int64", std::int8_t(-64)},
      {"uint8", std::uint8_t(8)},
      {"uint16", std::uint8_t(16)},
      {"uint32", std::uint8_t(32)},
      {"uint64", std::uint8_t(64)},
      {"string", std::string("sting value")}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool          boolean;
    std::int8_t   int8;
    std::int16_t  int16;
    std::int32_t  int32;
    std::int64_t  int64;
    std::uint8_t  uint8;
    std::uint16_t uint16;
    std::uint32_t uint32;
    std::uint64_t uint64;
    std::string   str;
  } form_data {
    form.at("bool").boolean().val(),
    form.at("int8").int8().val(),
    form.at("int16").int16().val(),
    form.at("int32").int32().val(),
    form.at("int64").int64().val(),
    form.at("uint8").uint8().val(),
    form.at("uint16").uint16().val(),
    form.at("uint32").uint32().val(),
    form.at("uint64").uint64().val(),
    form.at("string").string().val()
  };

  if (!form.is_good())
  {
    std::cerr << "Simple MsgPack FAILED!" << std::endl;
    return false;
  }

  if (!form_data.boolean
    || form_data.int8 != -8
    || form_data.int16 != -16
    || form_data.int32 != -32
    || form_data.int64 != -64
    || form_data.uint8 != 8
    || form_data.uint16 != 16
    || form_data.uint32 != 32
    || form_data.uint64 != 64
    || form_data.str != "sting value")
  {
    std::cerr << "Simple MsgPack FAILED!" << std::endl;
    return false;
  }


  std::cout << "Simple MsgPack passed." << std::endl;
  return true;
}